

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

int gtTileSeparate(TIFFRGBAImage *img,uint32_t *raster,uint32_t w,uint32_t h)

{
  int iVar1;
  uint32_t uVar2;
  ulong uVar3;
  tileSeparateRoutine tif_00;
  uint uVar4;
  int iVar5;
  uint uVar6;
  tmsize_t second;
  tmsize_t bufsizetoalloc;
  char *pcVar7;
  tmsize_t tVar8;
  uint uVar9;
  int local_19c;
  uchar *local_140;
  uchar *local_138;
  int local_130;
  uint32_t *puStack_108;
  uint32_t temp;
  uint32_t *right;
  uint32_t *left;
  uint32_t line;
  tmsize_t roffset;
  uint32_t leftmost_tw;
  int32_t leftmost_fromskew;
  int32_t leftmost_toskew;
  int32_t this_toskew;
  uint32_t tocol;
  uint32_t this_tw;
  int iStack_c4;
  uint16_t colorchannels;
  int flip;
  int ret;
  uint32_t nrow;
  int alpha;
  int32_t toskew;
  int32_t fromskew;
  tmsize_t bufsize;
  tmsize_t tilesize;
  uchar *pa;
  uchar *p2;
  uchar *p1;
  uchar *p0;
  uchar *buf;
  uint32_t th;
  uint32_t tw;
  tmsize_t pos;
  uint32_t rowstoread;
  uint32_t y;
  uint32_t row;
  uint32_t col;
  tileSeparateRoutine put;
  TIFF *tif;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t *raster_local;
  TIFFRGBAImage *img_local;
  
  put = (tileSeparateRoutine)img->tif;
  _row = img->put;
  p0 = (uchar *)0x0;
  p1 = (uchar *)0x0;
  p2 = (uchar *)0x0;
  pa = (uchar *)0x0;
  tilesize = 0;
  iVar1 = img->alpha;
  iStack_c4 = 1;
  tif._0_4_ = h;
  tif._4_4_ = w;
  _h_local = raster;
  raster_local = (uint32_t *)img;
  second = TIFFTileSize((TIFF *)put);
  iVar5 = 3;
  if (iVar1 != 0) {
    iVar5 = 4;
  }
  bufsizetoalloc = _TIFFMultiplySSize((TIFF *)put,(long)iVar5,second,"gtTileSeparate");
  if (bufsizetoalloc == 0) {
    img_local._4_4_ = 0;
  }
  else {
    TIFFGetField((TIFF *)put,0x142,(long)&buf + 4);
    TIFFGetField((TIFF *)put,0x143,&buf);
    uVar4 = setorientation((TIFFRGBAImage *)raster_local);
    tif_00 = put;
    if ((uVar4 & 1) == 0) {
      if (tif._4_4_ + 0x7fffffff < buf._4_4_) {
        pcVar7 = TIFFFileName((TIFF *)put);
        TIFFErrorExtR((TIFF *)tif_00,pcVar7,"%s","unsupported tile size (too wide)");
        return 0;
      }
      pos._4_4_ = 0;
    }
    else {
      if (0x7fffffff < buf._4_4_ + tif._4_4_) {
        pcVar7 = TIFFFileName((TIFF *)put);
        TIFFErrorExtR((TIFF *)tif_00,pcVar7,"%s","unsupported tile size (too wide)");
        return 0;
      }
      pos._4_4_ = (uint32_t)tif - 1;
    }
    if (((ushort)raster_local[9] < 2) || ((ushort)raster_local[9] == 3)) {
      tocol._2_2_ = 1;
    }
    else {
      tocol._2_2_ = 3;
    }
    uVar9 = raster_local[0x23] % buf._4_4_;
    iVar5 = buf._4_4_ - uVar9;
    for (rowstoread = 0; iStack_c4 != 0 && rowstoread < (uint32_t)tif;
        rowstoread = local_130 + rowstoread) {
      pos._0_4_ = (uint)buf - (rowstoread + raster_local[0x22]) % (uint)buf;
      local_130 = (int)pos;
      if ((uint32_t)tif < rowstoread + (int)pos) {
        local_130 = (uint32_t)tif - rowstoread;
      }
      leftmost_toskew = 0;
      y = raster_local[0x23];
      this_toskew = iVar5;
      alpha = uVar9;
      while ((uint)leftmost_toskew < tif._4_4_) {
        if (p0 == (uchar *)0x0) {
          tVar8 = _TIFFReadTileAndAllocBuffer
                            ((TIFF *)put,&p0,bufsizetoalloc,y,rowstoread + raster_local[0x22],0,0);
          if ((tVar8 == -1) && ((p0 == (uchar *)0x0 || (raster_local[2] != 0)))) {
            iStack_c4 = 0;
            break;
          }
          p1 = p0;
          if (tocol._2_2_ == 1) {
            p2 = p0;
            pa = p0;
            if (iVar1 == 0) {
              local_138 = (uchar *)0x0;
            }
            else {
              local_138 = p0 + second * 3;
            }
            tilesize = (tmsize_t)local_138;
          }
          else {
            p2 = p0 + second;
            pa = p2 + second;
            if (iVar1 == 0) {
              local_140 = (uchar *)0x0;
            }
            else {
              local_140 = pa + second;
            }
            tilesize = (tmsize_t)local_140;
          }
        }
        else {
          tVar8 = TIFFReadTile((TIFF *)put,p1,y,rowstoread + raster_local[0x22],0,0);
          if ((tVar8 == -1) && (raster_local[2] != 0)) {
            iStack_c4 = 0;
            break;
          }
        }
        if (((1 < tocol._2_2_) &&
            (tVar8 = TIFFReadTile((TIFF *)put,p2,y,rowstoread + raster_local[0x22],0,1), tVar8 == -1
            )) && (raster_local[2] != 0)) {
          iStack_c4 = 0;
          break;
        }
        if (((1 < tocol._2_2_) &&
            (tVar8 = TIFFReadTile((TIFF *)put,pa,y,rowstoread + raster_local[0x22],0,2), tVar8 == -1
            )) && (raster_local[2] != 0)) {
          iStack_c4 = 0;
          break;
        }
        if (((iVar1 != 0) &&
            (tVar8 = TIFFReadTile((TIFF *)put,(void *)tilesize,y,rowstoread + raster_local[0x22],0,
                                  tocol._2_2_), tVar8 == -1)) && (raster_local[2] != 0)) {
          iStack_c4 = 0;
          break;
        }
        uVar6 = rowstoread + raster_local[0x22];
        uVar3 = (ulong)(uint)buf;
        tVar8 = TIFFTileRowSize((TIFF *)put);
        _th = ((ulong)uVar6 % uVar3) * tVar8 +
              (long)alpha * (ulong)*(ushort *)((long)raster_local + 0x1e);
        if (tif._4_4_ < (uint)(leftmost_toskew + this_toskew)) {
          this_toskew = tif._4_4_ - leftmost_toskew;
        }
        (*_row)((TIFFRGBAImage *)raster_local);
        y = this_toskew + y;
        alpha = 0;
        leftmost_toskew = this_toskew + leftmost_toskew;
        this_toskew = buf._4_4_;
      }
      if ((uVar4 & 1) == 0) {
        local_19c = local_130;
      }
      else {
        local_19c = -local_130;
      }
      pos._4_4_ = local_19c + pos._4_4_;
    }
    if ((uVar4 & 2) != 0) {
      for (left._4_4_ = 0; left._4_4_ < (uint32_t)tif; left._4_4_ = left._4_4_ + 1) {
        right = _h_local + left._4_4_ * tif._4_4_;
        puStack_108 = right + tif._4_4_;
        for (; puStack_108 = puStack_108 + -1, right < puStack_108; right = right + 1) {
          uVar2 = *right;
          *right = *puStack_108;
          *puStack_108 = uVar2;
        }
      }
    }
    _TIFFfreeExt(*(TIFF **)raster_local,p0);
    img_local._4_4_ = iStack_c4;
  }
  return img_local._4_4_;
}

Assistant:

static int gtTileSeparate(TIFFRGBAImage *img, uint32_t *raster, uint32_t w,
                          uint32_t h)
{
    TIFF *tif = img->tif;
    tileSeparateRoutine put = img->put.separate;
    uint32_t col, row, y, rowstoread;
    tmsize_t pos;
    uint32_t tw, th;
    unsigned char *buf = NULL;
    unsigned char *p0 = NULL;
    unsigned char *p1 = NULL;
    unsigned char *p2 = NULL;
    unsigned char *pa = NULL;
    tmsize_t tilesize;
    tmsize_t bufsize;
    int32_t fromskew, toskew;
    int alpha = img->alpha;
    uint32_t nrow;
    int ret = 1, flip;
    uint16_t colorchannels;
    uint32_t this_tw, tocol;
    int32_t this_toskew, leftmost_toskew;
    int32_t leftmost_fromskew;
    uint32_t leftmost_tw;

    tilesize = TIFFTileSize(tif);
    bufsize =
        _TIFFMultiplySSize(tif, alpha ? 4 : 3, tilesize, "gtTileSeparate");
    if (bufsize == 0)
    {
        return (0);
    }

    TIFFGetField(tif, TIFFTAG_TILEWIDTH, &tw);
    TIFFGetField(tif, TIFFTAG_TILELENGTH, &th);

    flip = setorientation(img);
    if (flip & FLIP_VERTICALLY)
    {
        if ((tw + w) > INT_MAX)
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "%s",
                          "unsupported tile size (too wide)");
            return (0);
        }
        y = h - 1;
        toskew = -(int32_t)(tw + w);
    }
    else
    {
        if (tw > (INT_MAX + w))
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "%s",
                          "unsupported tile size (too wide)");
            return (0);
        }
        y = 0;
        toskew = -(int32_t)(tw - w);
    }

    switch (img->photometric)
    {
        case PHOTOMETRIC_MINISWHITE:
        case PHOTOMETRIC_MINISBLACK:
        case PHOTOMETRIC_PALETTE:
            colorchannels = 1;
            break;

        default:
            colorchannels = 3;
            break;
    }

    /*
     *	Leftmost tile is clipped on left side if col_offset > 0.
     */
    leftmost_fromskew = img->col_offset % tw;
    leftmost_tw = tw - leftmost_fromskew;
    leftmost_toskew = toskew + leftmost_fromskew;
    for (row = 0; ret != 0 && row < h; row += nrow)
    {
        rowstoread = th - (row + img->row_offset) % th;
        nrow = (row + rowstoread > h ? h - row : rowstoread);
        fromskew = leftmost_fromskew;
        this_tw = leftmost_tw;
        this_toskew = leftmost_toskew;
        tocol = 0;
        col = img->col_offset;
        while (tocol < w)
        {
            if (buf == NULL)
            {
                if (_TIFFReadTileAndAllocBuffer(tif, (void **)&buf, bufsize,
                                                col, row + img->row_offset, 0,
                                                0) == (tmsize_t)(-1) &&
                    (buf == NULL || img->stoponerr))
                {
                    ret = 0;
                    break;
                }
                p0 = buf;
                if (colorchannels == 1)
                {
                    p2 = p1 = p0;
                    pa = (alpha ? (p0 + 3 * tilesize) : NULL);
                }
                else
                {
                    p1 = p0 + tilesize;
                    p2 = p1 + tilesize;
                    pa = (alpha ? (p2 + tilesize) : NULL);
                }
            }
            else if (TIFFReadTile(tif, p0, col, row + img->row_offset, 0, 0) ==
                         (tmsize_t)(-1) &&
                     img->stoponerr)
            {
                ret = 0;
                break;
            }
            if (colorchannels > 1 &&
                TIFFReadTile(tif, p1, col, row + img->row_offset, 0, 1) ==
                    (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }
            if (colorchannels > 1 &&
                TIFFReadTile(tif, p2, col, row + img->row_offset, 0, 2) ==
                    (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }
            if (alpha &&
                TIFFReadTile(tif, pa, col, row + img->row_offset, 0,
                             colorchannels) == (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }

            pos = ((row + img->row_offset) % th) * TIFFTileRowSize(tif) +
                  ((tmsize_t)fromskew * img->samplesperpixel);
            if (tocol + this_tw > w)
            {
                /*
                 * Rightmost tile is clipped on right side.
                 */
                fromskew = tw - (w - tocol);
                this_tw = tw - fromskew;
                this_toskew = toskew + fromskew;
            }
            tmsize_t roffset = (tmsize_t)y * w + tocol;
            (*put)(img, raster + roffset, tocol, y, this_tw, nrow, fromskew,
                   this_toskew, p0 + pos, p1 + pos, p2 + pos,
                   (alpha ? (pa + pos) : NULL));
            tocol += this_tw;
            col += this_tw;
            /*
             * After the leftmost tile, tiles are no longer clipped on left
             * side.
             */
            fromskew = 0;
            this_tw = tw;
            this_toskew = toskew;
        }

        y += ((flip & FLIP_VERTICALLY) ? -(int32_t)nrow : (int32_t)nrow);
    }

    if (flip & FLIP_HORIZONTALLY)
    {
        uint32_t line;

        for (line = 0; line < h; line++)
        {
            uint32_t *left = raster + (line * w);
            uint32_t *right = left + w - 1;

            while (left < right)
            {
                uint32_t temp = *left;
                *left = *right;
                *right = temp;
                left++;
                right--;
            }
        }
    }

    _TIFFfreeExt(img->tif, buf);
    return (ret);
}